

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

monst * animate_statue(obj *statue,xchar x,xchar y,int cause,int *fail_reason)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  obj *poVar4;
  bool bVar5;
  char *local_190;
  char *local_180;
  char *local_178;
  bool local_151;
  char *comes_to_life;
  char statuename [256];
  boolean historic;
  coord cc;
  obj *item;
  monst *mon;
  permonst *mptr;
  int *fail_reason_local;
  int cause_local;
  xchar y_local;
  xchar x_local;
  obj *statue_local;
  
  local_151 = false;
  if ((urole.malenum == 0x159) && (local_151 = false, flags.mon_moving == '\0')) {
    local_151 = (statue->spe & 1U) != 0;
  }
  statuename[0xfd] = local_151;
  pcVar3 = xname(statue);
  pcVar3 = the(pcVar3);
  strcpy((char *)&comes_to_life,pcVar3);
  if ((statue->oxlth == 0) || ((*(uint *)&statue->field_0x4a >> 0x15 & 3) != 1)) {
    if ((mons[statue->corpsenm].mlet == '7') && (cause == 2)) {
      mon = (monst *)(mons + 0x106);
    }
    else {
      mon = (monst *)(mons + statue->corpsenm);
    }
    if ((((ulong)mon->data & 0x1000000000000000) != 0) && (cause != 2)) {
      if (fail_reason != (int *)0x0) {
        *fail_reason = 2;
      }
      return (monst *)0x0;
    }
    if ((cause == 2) &&
       ((((ulong)mon->data & 0x1000000000000000) != 0 || (*(char *)((long)&mon->mhp + 2) == '!'))))
    {
      item = (obj *)makemon(mons + 0x117,level,(int)x,(int)y,0x141);
      if (((monst *)item != (monst *)0x0) && ((*(uint *)&((monst *)item)->field_0x60 >> 4 & 7) == 2)
         ) {
        newcham(level,(monst *)item,(permonst *)mon,'\0','\0');
      }
    }
    else {
      iVar2 = 1;
      if (cause == 2) {
        iVar2 = 0x101;
      }
      item = (obj *)makemon((permonst *)mon,level,(int)x,(int)y,iVar2);
    }
  }
  else {
    statuename[0xfe] = x;
    statuename[0xff] = y;
    item = (obj *)montraits(statue,(coord *)(statuename + 0xfe));
    if ((((monst *)item != (monst *)0x0) && (((monst *)item)->mtame != '\0')) &&
       ((*(uint *)&((monst *)item)->field_0x60 >> 0x1a & 1) == 0)) {
      wary_dog((monst *)item,'\x01');
    }
  }
  if (item == (obj *)0x0) {
    if (fail_reason != (int *)0x0) {
      *fail_reason = 1;
    }
    return (monst *)0x0;
  }
  if (statue->owornmask != 0) {
    remove_worn_item(statue,'\x01');
  }
  if ((statue->spe & 2U) == 0) {
    if ((statue->spe & 4U) != 0) {
      item->owornmask = item->owornmask & 0xfffffffeU | 1;
    }
  }
  else {
    item->owornmask = item->owornmask & 0xfffffffe;
  }
  if (statue->onamelth != '\0') {
    item = (obj *)christen_monst((monst *)item,
                                 (char *)((long)statue->oextra + (long)(int)statue->oxlth));
  }
  while (poVar4 = statue->cobj, poVar4 != (obj *)0x0) {
    obj_extract_self(poVar4);
    add_to_minv((monst *)item,poVar4);
  }
  m_dowear(level,(monst *)item,'\x01');
  delobj(statue);
  if (item->field_0x59 == '\0') {
    item->owornmask = item->owornmask & 0xffffff7f;
  }
  else {
    seemimic((monst *)item);
  }
  if (((x == u.ux) && (y == u.uy)) || (cause == 2)) {
    bVar5 = true;
    if (((*(char *)&((item->v).v_nexthere)->v != '7') &&
        (bVar5 = true, (((item->v).v_ocarry)->mspec_used & 2U) == 0)) &&
       (bVar5 = true, *(char *)&((item->v).v_nexthere)->v != '\x16')) {
      bVar5 = (item->v).v_nexthere == (obj *)(mons + 0x33);
    }
    local_180 = "comes to life";
    if (bVar5) {
      local_180 = "moves";
    }
    if (cause == 2) {
      pcVar3 = upstart((char *)&comes_to_life);
      local_178 = local_180;
      if (*(char *)((long)item->oextra + 1) == '\0') {
        if (((viz_array[(char)item->corpsenm][(char)item->field_0x4f] & 2U) != 0) ||
           (((((u.uprops[0x1e].intrinsic == 0 &&
               ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
            (((u.uprops[0x40].intrinsic != 0 ||
              ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
             (((((item->v).v_nexthere)->oprops & 0x200) != 0 &&
              ((viz_array[(char)item->corpsenm][(char)item->field_0x4f] & 1U) != 0))))))))
        goto LAB_00306232;
LAB_003062bf:
        if (((((((item->v).v_nexthere)->quan & 0x10000U) != 0) ||
             ((poVar4 = which_armor((monst *)item,4), poVar4 != (obj *)0x0 &&
              (poVar4 = which_armor((monst *)item,4), poVar4->otyp == 0x4f)))) ||
            (((((u.uprops[0x1e].intrinsic == 0 &&
                (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                 (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
               ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) ||
              (((((u.uprops[0x19].intrinsic == 0 &&
                  ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
                 (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)) ||
               (u.uprops[0x19].blocked != 0)))) &&
             (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
              (iVar2 = dist2((int)(char)item->field_0x4f,(int)(char)item->corpsenm,(int)u.ux,
                             (int)u.uy), 0x40 < iVar2)))))) &&
           (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
            (bVar1 = match_warn_of_mon((monst *)item), bVar1 == '\0')))) {
          local_178 = "disappears";
        }
      }
      else {
        bVar1 = worm_known(level,(monst *)item);
        if (bVar1 == '\0') goto LAB_003062bf;
LAB_00306232:
        if (((((((uint)item->owornmask >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
             (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
           (((((uint)item->owornmask >> 7 & 1) != 0 || (((uint)item->owornmask >> 9 & 1) != 0)) ||
            (((byte)u._1052_1_ >> 5 & 1) != 0)))) goto LAB_003062bf;
      }
      pline("%s %s!",pcVar3,local_178);
    }
    else {
      if (*(char *)((long)item->oextra + 1) == '\0') {
        if (((viz_array[(char)item->corpsenm][(char)item->field_0x4f] & 2U) != 0) ||
           (((((u.uprops[0x1e].intrinsic == 0 &&
               (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
              ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
             ((u.uprops[0x40].intrinsic != 0 ||
              ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))))) &&
            (((((item->v).v_nexthere)->oprops & 0x200) != 0 &&
             ((viz_array[(char)item->corpsenm][(char)item->field_0x4f] & 1U) != 0))))))
        goto LAB_0030661f;
LAB_003066ac:
        if (((((((item->v).v_nexthere)->quan & 0x10000U) != 0) ||
             ((poVar4 = which_armor((monst *)item,4), poVar4 != (obj *)0x0 &&
              (poVar4 = which_armor((monst *)item,4), poVar4->otyp == 0x4f)))) ||
            ((((u.uprops[0x1e].intrinsic == 0 &&
               (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
              ((((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
                ((((u.uprops[0x19].intrinsic == 0 &&
                   ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
                  (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)))) ||
               (u.uprops[0x19].blocked != 0)))) &&
             (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
              (iVar2 = dist2((int)(char)item->field_0x4f,(int)(char)item->corpsenm,(int)u.ux,
                             (int)u.uy), 0x40 < iVar2)))))) &&
           (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
            (bVar1 = match_warn_of_mon((monst *)item), bVar1 == '\0')))) {
          local_180 = "disappears";
        }
      }
      else {
        bVar1 = worm_known(level,(monst *)item);
        if (bVar1 == '\0') goto LAB_003066ac;
LAB_0030661f:
        if ((((((((uint)item->owornmask >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
              (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
            ((((uint)item->owornmask >> 7 & 1) != 0 || (((uint)item->owornmask >> 9 & 1) != 0)))) ||
           (((byte)u._1052_1_ >> 5 & 1) != 0)) goto LAB_003066ac;
      }
      pline("The statue %s!",local_180);
    }
    if (statuename[0xfd] != '\0') {
      pline("You feel guilty that the historic statue is now gone.");
      adjalign(-1);
    }
    goto LAB_003070d2;
  }
  if (cause != 1) {
    if (*(char *)((long)item->oextra + 1) == '\0') {
      if (((viz_array[(char)item->corpsenm][(char)item->field_0x4f] & 2U) != 0) ||
         (((((u.uprops[0x1e].intrinsic == 0 && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
            && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
           ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
          (((u.uprops[0x40].intrinsic != 0 ||
            ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
           (((((item->v).v_nexthere)->oprops & 0x200) != 0 &&
            ((viz_array[(char)item->corpsenm][(char)item->field_0x4f] & 1U) != 0))))))))
      goto LAB_00306e44;
LAB_00306ed1:
      if (((((((item->v).v_nexthere)->quan & 0x10000U) == 0) &&
           ((poVar4 = which_armor((monst *)item,4), poVar4 == (obj *)0x0 ||
            (poVar4 = which_armor((monst *)item,4), poVar4->otyp != 0x4f)))) &&
          ((((u.uprops[0x1e].intrinsic != 0 ||
             (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
              (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
            ((((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
              ((((u.uprops[0x19].intrinsic != 0 ||
                 ((u.uprops[0x19].extrinsic != 0 || (youmonst.data == mons + 0x1e)))) ||
                (youmonst.data == mons + 0x31)) || (youmonst.data == mons + 0x32)))) &&
             (u.uprops[0x19].blocked == 0)))) ||
           (((u.uprops[0x19].extrinsic != 0 && (u.uprops[0x19].blocked == 0)) &&
            (iVar2 = dist2((int)(char)item->field_0x4f,(int)(char)item->corpsenm,(int)u.ux,(int)u.uy
                          ), iVar2 < 0x41)))))) ||
         (((u.uprops[0x42].intrinsic != 0 || (u.uprops[0x42].extrinsic != 0)) ||
          (bVar1 = match_warn_of_mon((monst *)item), bVar1 != '\0')))) goto LAB_00307094;
      local_190 = "something";
    }
    else {
      bVar1 = worm_known(level,(monst *)item);
      if (bVar1 == '\0') goto LAB_00306ed1;
LAB_00306e44:
      if (((((((uint)item->owornmask >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
           (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
         (((((uint)item->owornmask >> 7 & 1) != 0 || (((uint)item->owornmask >> 9 & 1) != 0)) ||
          (((byte)u._1052_1_ >> 5 & 1) != 0)))) goto LAB_00306ed1;
LAB_00307094:
      local_190 = a_monnam((monst *)item);
    }
    pline("You find %s posing as a statue.",local_190);
    stop_occupation();
    goto LAB_003070d2;
  }
  if (*(char *)((long)item->oextra + 1) == '\0') {
    if (((viz_array[(char)item->corpsenm][(char)item->field_0x4f] & 2U) != 0) ||
       (((((u.uprops[0x1e].intrinsic == 0 && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
          && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
        (((u.uprops[0x40].intrinsic != 0 ||
          ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
         (((((item->v).v_nexthere)->oprops & 0x200) != 0 &&
          ((viz_array[(char)item->corpsenm][(char)item->field_0x4f] & 1U) != 0))))))))
    goto LAB_00306a2d;
LAB_00306ac2:
    if (((((item->v).v_nexthere)->quan & 0x10000U) == 0) &&
       ((poVar4 = which_armor((monst *)item,4), poVar4 == (obj *)0x0 ||
        (poVar4 = which_armor((monst *)item,4), poVar4->otyp != 0x4f)))) {
      if ((((u.uprops[0x1e].intrinsic != 0) ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
           ((((u.uprops[0x19].intrinsic != 0 ||
              ((u.uprops[0x19].extrinsic != 0 || (youmonst.data == mons + 0x1e)))) ||
             (youmonst.data == mons + 0x31)) || (youmonst.data == mons + 0x32)))))) &&
         (bVar5 = true, u.uprops[0x19].blocked == 0)) goto LAB_00306cba;
      if ((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) {
        iVar2 = dist2((int)(char)item->field_0x4f,(int)(char)item->corpsenm,(int)u.ux,(int)u.uy);
        bVar5 = true;
        if (iVar2 < 0x41) goto LAB_00306cba;
      }
    }
    bVar5 = true;
    if ((u.uprops[0x42].intrinsic == 0) && (bVar5 = true, u.uprops[0x42].extrinsic == 0)) {
      bVar1 = match_warn_of_mon((monst *)item);
      bVar5 = bVar1 != '\0';
    }
  }
  else {
    bVar1 = worm_known(level,(monst *)item);
    if (bVar1 == '\0') goto LAB_00306ac2;
LAB_00306a2d:
    if ((((((((uint)item->owornmask >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
          (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
        ((((uint)item->owornmask >> 7 & 1) != 0 || (((uint)item->owornmask >> 9 & 1) != 0)))) ||
       (bVar5 = true, ((byte)u._1052_1_ >> 5 & 1) != 0)) goto LAB_00306ac2;
  }
LAB_00306cba:
  pcVar3 = "disappears";
  if (bVar5) {
    pcVar3 = "comes to life";
  }
  pline("Instead of shattering, the statue suddenly %s!",pcVar3);
LAB_003070d2:
  if ((((x == u.ux) && (y == u.uy)) && (u.umonnum != u.umonster)) &&
     ((((youmonst.data)->mflags1 & 0x80) != 0 && (level->objects[x][y] == (obj *)0x0)))) {
    u._1052_1_ = u._1052_1_ & 0xfb;
  }
  if (fail_reason != (int *)0x0) {
    *fail_reason = 0;
  }
  return (monst *)item;
}

Assistant:

struct monst *animate_statue(struct obj *statue, xchar x, xchar y, int cause,
			     int *fail_reason)
{
	const struct permonst *mptr;
	struct monst *mon = 0;
	struct obj *item;
	coord cc;
	boolean historic = (Role_if (PM_ARCHEOLOGIST) && !flags.mon_moving && (statue->spe & STATUE_HISTORIC));
	char statuename[BUFSZ];

	strcpy(statuename,the(xname(statue)));

	if (statue->oxlth && statue->oattached == OATTACHED_MONST) {
	    cc.x = x,  cc.y = y;
	    mon = montraits(statue, &cc);
	    if (mon && mon->mtame && !mon->isminion)
		wary_dog(mon, TRUE);
	} else {
	    /* statue of any golem hit with stone-to-flesh becomes flesh golem */
	    if (is_golem(&mons[statue->corpsenm]) && cause == ANIMATE_SPELL)
	    	mptr = &mons[PM_FLESH_GOLEM];
	    else
		mptr = &mons[statue->corpsenm];
	    /*
	     * Guard against someone wishing for a statue of a unique monster
	     * (which is allowed in normal play) and then tossing it onto the
	     * [detected or guessed] location of a statue trap.  Normally the
	     * uppermost statue is the one which would be activated.
	     */
	    if ((mptr->geno & G_UNIQ) && cause != ANIMATE_SPELL) {
	        if (fail_reason) *fail_reason = AS_MON_IS_UNIQUE;
	        return NULL;
	    }
	    if (cause == ANIMATE_SPELL &&
		((mptr->geno & G_UNIQ) || mptr->msound == MS_GUARDIAN)) {
		/* Statues of quest guardians or unique monsters
		 * will not stone-to-flesh as the real thing.
		 */
		mon = makemon(&mons[PM_DOPPELGANGER], level, x, y,
			NO_MINVENT|MM_NOCOUNTBIRTH|MM_ADJACENTOK);
		if (mon) {
			/* makemon() will set mon->cham to
			 * CHAM_ORDINARY if hero is wearing
			 * ring of protection from shape changers
			 * when makemon() is called, so we have to
			 * check the field before calling newcham().
			 */
			if (mon->cham == CHAM_DOPPELGANGER)
				newcham(level, mon, mptr, FALSE, FALSE);
		}
	    } else
		mon = makemon(mptr, level, x, y, (cause == ANIMATE_SPELL) ?
			(NO_MINVENT | MM_ADJACENTOK) : NO_MINVENT);
	}

	if (!mon) {
	    if (fail_reason) *fail_reason = AS_NO_MON;
	    return NULL;
	}

	/* in case statue is wielded and hero zaps stone-to-flesh at self */
	if (statue->owornmask) remove_worn_item(statue, TRUE);

	/* allow statues to be of a specific gender */
	if (statue->spe & STATUE_MALE)
	    mon->female = FALSE;
	else if (statue->spe & STATUE_FEMALE)
	    mon->female = TRUE;
	/* if statue has been named, give same name to the monster */
	if (statue->onamelth)
	    mon = christen_monst(mon, ONAME(statue));
	/* transfer any statue contents to monster's inventory */
	while ((item = statue->cobj) != 0) {
	    obj_extract_self(item);
	    add_to_minv(mon, item);
	}
	m_dowear(level, mon, TRUE);
	delobj(statue);

	/* mimic statue becomes seen mimic; other hiders won't be hidden */
	if (mon->m_ap_type) seemimic(mon);
	else mon->mundetected = FALSE;
	if ((x == u.ux && y == u.uy) || cause == ANIMATE_SPELL) {
	    const char *comes_to_life = nonliving(mon->data) ?
					"moves" : "comes to life"; 
	    if (cause == ANIMATE_SPELL)
	    	pline("%s %s!", upstart(statuename),
	    		canspotmon(level, mon) ? comes_to_life : "disappears");
	    else
		pline("The statue %s!",
			canspotmon(level, mon) ? comes_to_life : "disappears");
	    if (historic) {
		    pline("You feel guilty that the historic statue is now gone.");
		    adjalign(-1);
	    }
	} else if (cause == ANIMATE_SHATTER)
	    pline("Instead of shattering, the statue suddenly %s!",
		canspotmon(level, mon) ? "comes to life" : "disappears");
	else { /* cause == ANIMATE_NORMAL */
	    pline("You find %s posing as a statue.",
		canspotmon(level, mon) ? a_monnam(mon) : "something");
	    stop_occupation();
	}
	/* avoid hiding under nothing */
	if (x == u.ux && y == u.uy &&
		Upolyd && hides_under(youmonst.data) && !OBJ_AT(x, y))
	    u.uundetected = 0;

	if (fail_reason) *fail_reason = AS_OK;
	return mon;
}